

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O2

double __thiscall ChebTools::ChebyshevExpansion::real_roots_time(ChebyshevExpansion *this,long N)

{
  long lVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> ypts;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar2 = 0;
  if (0 < N) {
    lVar2 = N;
  }
  while (lVar2 != 0) {
    real_roots(&ypts,this,true);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ypts.super__Vector_base<double,_std::allocator<double>_>);
    lVar2 = lVar2 + -1;
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  return (((double)(lVar2 - lVar1) / 1000000000.0) / (double)N) * 1000000.0;
}

Assistant:

double ChebyshevExpansion::real_roots_time(long N) {
    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        auto ypts = real_roots();
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    return elap_us;
}